

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall
icu_63::DateFormatSymbols::setWeekdays
          (DateFormatSymbols *this,UnicodeString *weekdaysArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  UnicodeString *pUVar4;
  UMemory *pUVar5;
  UnicodeString *pUVar6;
  long lVar7;
  
  if (context == STANDALONE) {
    switch(width) {
    case ABBREVIATED:
      pUVar6 = this->fStandaloneShortWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneShortWeekdays = pUVar6;
      lVar3 = 0xf0;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    case WIDE:
      pUVar6 = this->fStandaloneWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneWeekdays = pUVar6;
      lVar3 = 0xe0;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    case NARROW:
      pUVar6 = this->fStandaloneNarrowWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneNarrowWeekdays = pUVar6;
      lVar3 = 0x110;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    case SHORT:
      pUVar6 = this->fStandaloneShorterWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fStandaloneShorterWeekdays = pUVar6;
      lVar3 = 0x100;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    default:
      goto switchD_002e4aa9_default;
    }
  }
  else {
    if (context != FORMAT) {
      return;
    }
    switch(width) {
    case ABBREVIATED:
      pUVar6 = this->fShortWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fShortWeekdays = pUVar6;
      lVar3 = 0xb0;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    case WIDE:
      pUVar6 = this->fWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fWeekdays = pUVar6;
      lVar3 = 0xa0;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    case NARROW:
      pUVar6 = this->fNarrowWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fNarrowWeekdays = pUVar6;
      lVar3 = 0xd0;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    case SHORT:
      pUVar6 = this->fShorterWeekdays;
      pUVar4 = weekdaysArray;
      if (pUVar6 != (UnicodeString *)0x0) {
        lVar3 = *(long *)((long)&pUVar6[-1].fUnion + 0x30);
        if (lVar3 != 0) {
          lVar3 = lVar3 << 6;
          do {
            icu_63::UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar6[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar6[-1].fUnion + 0x30),pUVar4);
      }
      lVar7 = (long)(int)(count + (uint)(count == 0));
      lVar3 = lVar7 * 0x40;
      pUVar5 = (UMemory *)0xffffffffffffffff;
      if (-1 < count) {
        pUVar5 = (UMemory *)(lVar3 + 8);
      }
      plVar1 = (long *)UMemory::operator_new__(pUVar5,(size_t)pUVar4);
      if (plVar1 == (long *)0x0) {
        pUVar6 = (UnicodeString *)0x0;
      }
      else {
        *plVar1 = lVar7;
        pUVar6 = (UnicodeString *)(plVar1 + 1);
        lVar7 = 0;
        do {
          *(undefined ***)((long)plVar1 + lVar7 + 8) = &PTR__UnicodeString_0048be70;
          *(undefined2 *)((long)plVar1 + lVar7 + 0x10) = 2;
          lVar7 = lVar7 + 0x40;
        } while (lVar3 != lVar7);
      }
      this->fShorterWeekdays = pUVar6;
      lVar3 = 0xc0;
      if (0 < count) {
        iVar2 = count + 1;
        do {
          icu_63::UnicodeString::operator=(pUVar6,weekdaysArray);
          iVar2 = iVar2 + -1;
          pUVar6 = pUVar6 + 1;
          weekdaysArray = weekdaysArray + 1;
        } while (1 < iVar2);
      }
      break;
    default:
      goto switchD_002e4aa9_default;
    }
  }
  *(int32_t *)((long)&(this->super_UObject)._vptr_UObject + lVar3) = count;
switchD_002e4aa9_default:
  return;
}

Assistant:

void
DateFormatSymbols::setWeekdays(const UnicodeString* weekdaysArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fWeekdays)
                delete[] fWeekdays;
            fWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fWeekdays, count);
            fWeekdaysCount = count;
            break;
        case ABBREVIATED :
            if (fShortWeekdays)
                delete[] fShortWeekdays;
            fShortWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fShortWeekdays, count);
            fShortWeekdaysCount = count;
            break;
        case SHORT :
            if (fShorterWeekdays)
                delete[] fShorterWeekdays;
            fShorterWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fShorterWeekdays, count);
            fShorterWeekdaysCount = count;
            break;
        case NARROW :
            if (fNarrowWeekdays)
                delete[] fNarrowWeekdays;
            fNarrowWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fNarrowWeekdays, count);
            fNarrowWeekdaysCount = count;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneWeekdays)
                delete[] fStandaloneWeekdays;
            fStandaloneWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneWeekdays, count);
            fStandaloneWeekdaysCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortWeekdays)
                delete[] fStandaloneShortWeekdays;
            fStandaloneShortWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneShortWeekdays, count);
            fStandaloneShortWeekdaysCount = count;
            break;
        case SHORT :
            if (fStandaloneShorterWeekdays)
                delete[] fStandaloneShorterWeekdays;
            fStandaloneShorterWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneShorterWeekdays, count);
            fStandaloneShorterWeekdaysCount = count;
            break;
        case NARROW :
            if (fStandaloneNarrowWeekdays)
                delete[] fStandaloneNarrowWeekdays;
            fStandaloneNarrowWeekdays = newUnicodeStringArray(count);
            uprv_arrayCopy(weekdaysArray, fStandaloneNarrowWeekdays, count);
            fStandaloneNarrowWeekdaysCount = count;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}